

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O0

bool __thiscall
miniros::ServiceManager::advertiseService(ServiceManager *this,AdvertiseServiceOptions *ops)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  element_type *this_01;
  string *rhs;
  XmlRpcValue *__a;
  long in_RSI;
  long in_RDI;
  value_type *__x;
  char uri_buf [1024];
  XmlRpcValue payload;
  XmlRpcValue result;
  XmlRpcValue args;
  ServicePublicationPtr pub;
  bool enabled;
  scoped_lock<std::mutex> lock;
  scoped_lock<std::recursive_mutex> shutdown_lock;
  mutex_type *in_stack_fffffffffffffa08;
  Level level;
  LogLocation *in_stack_fffffffffffffa10;
  string *in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  XmlRpcValue *in_stack_fffffffffffffa30;
  string *in_stack_fffffffffffffa38;
  LogLocation *in_stack_fffffffffffffa40;
  XmlRpcValue *in_stack_fffffffffffffa48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa78;
  shared_ptr<miniros::ServiceCallbackHelper> *in_stack_fffffffffffffaa0;
  void *logger_handle;
  undefined4 in_stack_fffffffffffffaa8;
  Level LVar4;
  undefined4 in_stack_fffffffffffffaac;
  shared_ptr<const_void> *in_stack_fffffffffffffab0;
  allocator<char> local_531;
  string local_530 [55];
  allocator<char> local_4f9;
  string local_4f8 [48];
  char local_4c8 [128];
  undefined1 in_stack_fffffffffffffcd7;
  RpcValue *in_stack_fffffffffffffcd8;
  RpcValue *in_stack_fffffffffffffce0;
  RpcValue *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  MasterLink *in_stack_fffffffffffffcf8;
  XmlRpcValue local_a8;
  XmlRpcValue local_98;
  XmlRpcValue local_88 [2];
  undefined1 local_62;
  allocator<char> local_61;
  string local_60 [60];
  int local_24;
  long local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::scoped_lock<std::recursive_mutex>::scoped_lock
            ((scoped_lock<std::recursive_mutex> *)in_stack_fffffffffffffa10,
             (mutex_type *)in_stack_fffffffffffffa08);
  if (((*(byte *)(in_RDI + 0x80) & 1) == 0) &&
     (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0xe0)), bVar1)) {
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
    level = (Level)((ulong)in_stack_fffffffffffffa08 >> 0x20);
    bVar1 = isServiceAdvertised((ServiceManager *)
                                CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                                in_stack_fffffffffffffa20);
    if (bVar1) {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((advertiseService::loc.initialized_ ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   (allocator<char> *)in_stack_fffffffffffffa40);
        console::initializeLogLocation
                  (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                   (Level)((ulong)in_stack_fffffffffffffa30 >> 0x20));
        std::__cxx11::string::~string(local_60);
        std::allocator<char>::~allocator(&local_61);
      }
      if (advertiseService::loc.level_ != Error) {
        console::setLogLocationLevel(in_stack_fffffffffffffa10,level);
        console::checkLogLocationEnabled((LogLocation *)in_stack_fffffffffffffa20);
      }
      local_62 = (advertiseService::loc.logger_enabled_ & 1U) != 0;
      if ((bool)local_62) {
        logger_handle = advertiseService::loc.logger_;
        LVar4 = advertiseService::loc.level_;
        in_stack_fffffffffffffa10 = (LogLocation *)std::__cxx11::string::c_str();
        level = Debug;
        console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_manager.cpp"
                       ,0x83,
                       "bool miniros::ServiceManager::advertiseService(const AdvertiseServiceOptions &)"
                      );
      }
      local_1 = 0;
      local_24 = 1;
    }
    else {
      level = (Level)((ulong)(local_18 + 0xa0) >> 0x20);
      in_stack_fffffffffffffa10 = (LogLocation *)(local_18 + 0xb0);
      __x = (value_type *)(local_18 + 0xb8);
      std::
      make_shared<miniros::ServicePublication,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::shared_ptr<miniros::ServiceCallbackHelper>const&,miniros::CallbackQueueInterface*const&,std::shared_ptr<void_const>const&>
                (in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                 in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffaa0,
                 (CallbackQueueInterface **)
                 CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                 in_stack_fffffffffffffab0);
      std::__cxx11::
      list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
      ::push_back((list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                   *)in_stack_fffffffffffffa20,__x);
      std::shared_ptr<miniros::ServicePublication>::~shared_ptr
                ((shared_ptr<miniros::ServicePublication> *)0x4ae235);
      local_24 = 0;
    }
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4ae24d);
    if (local_24 == 0) {
      XmlRpc::XmlRpcValue::XmlRpcValue(local_88);
      XmlRpc::XmlRpcValue::XmlRpcValue(&local_98);
      XmlRpc::XmlRpcValue::XmlRpcValue(&local_a8);
      this_node::getName_abi_cxx11_();
      XmlRpc::XmlRpcValue::XmlRpcValue
                (in_stack_fffffffffffffa30,
                 (string *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffa10,level);
      XmlRpc::XmlRpcValue::operator=
                ((XmlRpcValue *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
      XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4ae2ee);
      XmlRpc::XmlRpcValue::XmlRpcValue
                (in_stack_fffffffffffffa30,
                 (string *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffa10,level);
      XmlRpc::XmlRpcValue::operator=
                ((XmlRpcValue *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
      XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4ae33f);
      __s = local_4c8;
      network::getHost_abi_cxx11_();
      uVar3 = std::__cxx11::string::c_str();
      std::__shared_ptr_access<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4ae37b);
      uVar2 = ConnectionManager::getTCPPort((ConnectionManager *)0x4ae383);
      snprintf(__s,0x400,"rosrpc://%s:%d",uVar3,(ulong)uVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                 (allocator<char> *)in_stack_fffffffffffffa40);
      XmlRpc::XmlRpcValue::XmlRpcValue
                (in_stack_fffffffffffffa30,
                 (string *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffa10,level);
      XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)this_00,in_stack_fffffffffffffa48);
      XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4ae42a);
      std::__cxx11::string::~string(local_4f8);
      std::allocator<char>::~allocator(&local_4f9);
      this_01 = std::
                __shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4ae458);
      rhs = RPCManager::getServerURI_abi_cxx11_(this_01);
      XmlRpc::XmlRpcValue::XmlRpcValue
                (in_stack_fffffffffffffa30,
                 (string *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      __a = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffa10,level);
      XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)this_00,(XmlRpcValue *)rhs);
      XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4ae4b5);
      std::__shared_ptr_access<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4ae4c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)rhs,(allocator<char> *)__a)
      ;
      MasterLink::execute(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                          in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                          in_stack_fffffffffffffcd8,(bool)in_stack_fffffffffffffcd7);
      std::__cxx11::string::~string(local_530);
      std::allocator<char>::~allocator(&local_531);
      local_1 = 1;
      local_24 = 1;
      XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4ae576);
      XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4ae583);
      XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4ae590);
    }
  }
  else {
    local_1 = 0;
    local_24 = 1;
  }
  std::scoped_lock<std::recursive_mutex>::~scoped_lock
            ((scoped_lock<std::recursive_mutex> *)0x4ae765);
  return (bool)(local_1 & 1);
}

Assistant:

bool ServiceManager::advertiseService(const AdvertiseServiceOptions& ops)
{
  std::scoped_lock<std::recursive_mutex> shutdown_lock(shutting_down_mutex_);
  if (shutting_down_ || !master_link_)
  {
    return false;
  }

  {
    std::scoped_lock<std::mutex> lock(service_publications_mutex_);

    if (isServiceAdvertised(ops.service))
    {
      MINIROS_ERROR("Tried to advertise a service that is already advertised in this node [%s]", ops.service.c_str());
      return false;
    }

    ServicePublicationPtr pub = std::make_shared<ServicePublication>(ops.service, ops.md5sum, ops.datatype,
      ops.req_datatype, ops.res_datatype, ops.helper, ops.callback_queue, ops.tracked_object);
    service_publications_.push_back(pub);
  }

  XmlRpcValue args, result, payload;
  args[0] = this_node::getName();
  args[1] = ops.service;
  char uri_buf[1024];
  std::snprintf(uri_buf, sizeof(uri_buf), "rosrpc://%s:%d",
           network::getHost().c_str(), connection_manager_->getTCPPort());
  args[2] = string(uri_buf);
  args[3] = xmlrpc_manager_->getServerURI();
  master_link_->execute("registerService", args, result, payload, true);

  return true;
}